

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

bool __thiscall
ChebTools::ChebyshevExpansion::has_real_roots_Descartes(ChebyshevExpansion *this,double reltol)

{
  size_t sVar1;
  size_t sVar2;
  int N_changes_n11;
  int N_changes_xmax;
  int N_changes_xmin;
  Array<double,__1,_1,_0,__1,_1> local_b8;
  Array<double,__1,_1,_0,__1,_1> local_a8;
  Nested local_98;
  undefined1 local_90 [8];
  ArrayXd coeff_shift_xmax;
  Nested local_70;
  Array<double,__1,_1,_0,__1,_1> local_68;
  Array<double,__1,_1,_0,__1,_1> local_58;
  Nested local_48;
  undefined1 local_40 [8];
  ArrayXd coeff_shift_xmin;
  undefined1 local_28 [7];
  anon_class_1_0_00000001 shift_poly_Horner;
  ArrayXd coefderiv_mono;
  double reltol_local;
  ChebyshevExpansion *this_local;
  
  to_monomial_increasing((ChebyshevExpansion *)local_28);
  local_70 = (Nested)Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::reverse
                               ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_28);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((Array<double,_1,1,0,_1,1> *)&local_68,&local_70);
  has_real_roots_Descartes::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_58,
             (ArrayXd *)
             ((long)&coeff_shift_xmin.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows + 7),-1.0);
  local_48 = (Nested)Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::reverse
                               ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_58);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((Array<double,_1,1,0,_1,1> *)local_40,&local_48);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_58);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_68);
  _N_changes_xmin =
       Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::reverse
                 ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_28);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((Array<double,_1,1,0,_1,1> *)&local_b8,&N_changes_xmin);
  has_real_roots_Descartes::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_a8,
             (ArrayXd *)
             ((long)&coeff_shift_xmin.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows + 7),1.0);
  local_98 = (Nested)Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::reverse
                               ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_a8);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((Array<double,_1,1,0,_1,1> *)local_90,&local_98);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_a8);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_b8);
  sVar1 = count_sign_changes((ArrayXd *)local_40,reltol);
  sVar2 = count_sign_changes((ArrayXd *)local_90,reltol);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_90);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_40);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_28);
  return (int)sVar2 != (int)sVar1;
}

Assistant:

bool ChebyshevExpansion::has_real_roots_Descartes(const double reltol) const {
        
        // Turn derivative expansion into polynomial
        // as monomial-basis in increasing order
        auto coefderiv_mono = to_monomial_increasing();
    
        // Optimized Polynomial Taylor shift using the Horner method
        // See: http://www.hvks.com/Numerical/Downloads/HVE%20Polynomial%20Taylor%20shifting.pdf
        auto shift_poly_Horner = [](const Eigen::ArrayXd& a_decreasing, double shift){
            int n = a_decreasing.size()-1;
            Eigen::ArrayXd a = a_decreasing;
            if (shift == 0) return a; // No shift, no change
            for (int j = 1; j <= n; ++j){
                for (int i = 1; i <= n - j + 1; ++i){
                    a[i] += shift*a[i - 1];
                }
            }
            return a;
        };
        
        Eigen::ArrayXd coeff_shift_xmin = shift_poly_Horner(coefderiv_mono.reverse(), -1).reverse();
        Eigen::ArrayXd coeff_shift_xmax = shift_poly_Horner(coefderiv_mono.reverse(), 1).reverse();
//        std::cout << coeff_shift_xmin << std::endl;
//        std::cout << coeff_shift_xmax << std::endl;
        int N_changes_xmin = count_sign_changes(coeff_shift_xmin, reltol); // Number of roots in [-1, inf)
        int N_changes_xmax = count_sign_changes(coeff_shift_xmax, reltol); // Number of roots in [1, inf)
        
        // Difference between these two are the number of roots inside [-1,1]
        int N_changes_n11 = N_changes_xmax - N_changes_xmin;
        
        // If the same, there are no additional extrema in [-1, 1], and the function is monotonic
        return (N_changes_n11 != 0);
    }